

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O0

void __thiscall
yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::lock_shared
          (shared_mutex_base<yamc::rwlock::ReaderPrefer> *this)

{
  bool bVar1;
  system_error *psVar2;
  error_code eVar3;
  error_code __ec;
  error_code __ec_00;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lk;
  id tid;
  shared_mutex_base<yamc::rwlock::ReaderPrefer> *this_local;
  
  lk._8_8_ = std::this_thread::get_id();
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mtx_);
  bVar1 = std::operator==((id)(this->e_owner_)._M_thread,(id)lk._8_8_);
  if ((!bVar1) && (bVar1 = is_shared_owner(this,(id)lk._8_8_), !bVar1)) {
    while( true ) {
      bVar1 = rwlock::ReaderPrefer::wait_rlock(&this->state_);
      if (!bVar1) {
        rwlock::ReaderPrefer::acquire_rlock(&this->state_);
        std::vector<std::thread::id,_std::allocator<std::thread::id>_>::push_back
                  (&this->s_owner_,(value_type *)&lk._M_owns);
        validator::deadlock::locked((uintptr_t)this,(id)lk._8_8_,true);
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
        return;
      }
      bVar1 = validator::deadlock::enqueue((uintptr_t)this,(id)lk._8_8_,true);
      if (!bVar1) break;
      std::condition_variable::wait((unique_lock *)&this->cv_);
      validator::deadlock::dequeue((uintptr_t)this,(id)lk._8_8_);
    }
    psVar2 = (system_error *)__cxa_allocate_exception(0x20);
    eVar3 = std::make_error_code(resource_deadlock_would_occur);
    __ec_00._M_cat = eVar3._M_cat;
    __ec_00._4_4_ = 0;
    __ec_00._M_value = eVar3._M_value;
    std::system_error::system_error(psVar2,__ec_00,"deadlock");
    __cxa_throw(psVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  psVar2 = (system_error *)__cxa_allocate_exception(0x20);
  eVar3 = std::make_error_code(resource_deadlock_would_occur);
  __ec._M_cat = eVar3._M_cat;
  __ec._4_4_ = 0;
  __ec._M_value = eVar3._M_value;
  std::system_error::system_error(psVar2,__ec,"recursive lock_shared");
  __cxa_throw(psVar2,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void lock_shared()
  {
    const auto tid = std::this_thread::get_id();
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    if (e_owner_ == tid || is_shared_owner(tid)) {
      // non-recursive semantics
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
#else
      throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), "recursive lock_shared");
#endif
    }
    while (RwLockPolicy::wait_rlock(state_)) {
      if (!validator::enqueue(reinterpret_cast<uintptr_t>(this), tid, true)) {
        // deadlock detection
#if YAMC_CHECKED_CALL_ABORT
        std::abort();
#else
        throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), "deadlock");
#endif
      }
      cv_.wait(lk);
      validator::dequeue(reinterpret_cast<uintptr_t>(this), tid);
    }
    RwLockPolicy::acquire_rlock(state_);
    s_owner_.push_back(tid);
    validator::locked(reinterpret_cast<uintptr_t>(this), tid, true);
  }